

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O3

Point3f pbrt::SampleSphericalRectangle
                  (Point3f *pRef,Point3f *s,Vector3f *ex,Vector3f *ey,Point2f *u,Float *pdf)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined8 uVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ulong uVar20;
  int iVar21;
  long in_FS_OFFSET;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined4 uVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  undefined1 auVar55 [16];
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar61 [16];
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  Point3f PVar70;
  float local_138;
  float local_134;
  float local_130;
  float local_120;
  uint local_118;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  
  uVar1 = (ex->super_Tuple3<pbrt::Vector3,_float>).y;
  uVar7 = (ex->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar31._4_4_ = uVar7;
  auVar31._0_4_ = uVar1;
  auVar31._8_8_ = 0;
  uVar2 = (ey->super_Tuple3<pbrt::Vector3,_float>).y;
  uVar8 = (ey->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar50._4_4_ = uVar8;
  auVar50._0_4_ = uVar2;
  auVar50._8_8_ = 0;
  auVar36 = vinsertps_avx(ZEXT416((uint)(ex->super_Tuple3<pbrt::Vector3,_float>).x),
                          ZEXT416((uint)(ey->super_Tuple3<pbrt::Vector3,_float>).x),0x10);
  auVar55 = vinsertps_avx(auVar31,auVar50,0x1c);
  auVar14 = vinsertps_avx(auVar50,auVar31,0x4c);
  auVar32._0_4_ = auVar55._0_4_ * auVar55._0_4_;
  auVar32._4_4_ = auVar55._4_4_ * auVar55._4_4_;
  auVar32._8_4_ = auVar55._8_4_ * auVar55._8_4_;
  auVar32._12_4_ = auVar55._12_4_ * auVar55._12_4_;
  auVar55 = vfmadd231ps_fma(auVar32,auVar36,auVar36);
  auVar55 = vfmadd213ps_fma(auVar14,auVar14,auVar55);
  auVar34 = vsqrtps_avx(auVar55);
  uVar37 = auVar34._0_4_;
  auVar55._4_4_ = uVar37;
  auVar55._0_4_ = uVar37;
  auVar55._8_4_ = uVar37;
  auVar55._12_4_ = uVar37;
  auVar36 = vdivps_avx(auVar36,auVar34);
  auVar55 = vdivps_avx(auVar31,auVar55);
  auVar31 = vmovshdup_avx(auVar34);
  auVar14 = vdivps_avx(auVar50,auVar31);
  auVar50 = vmovshdup_avx(auVar36);
  auVar22 = vpermi2ps_avx512vl(_DAT_004ffae0,auVar36,auVar55);
  auVar35 = vmovshdup_avx(auVar55);
  auVar32 = vinsertps_avx(auVar36,auVar14,0x4c);
  auVar33 = vmovshdup_avx(auVar14);
  fVar58 = auVar14._0_4_;
  auVar27._0_4_ = fVar58 * auVar22._0_4_;
  auVar27._4_4_ = auVar14._4_4_ * auVar22._4_4_;
  auVar27._8_4_ = auVar14._8_4_ * auVar22._8_4_;
  auVar27._12_4_ = auVar14._12_4_ * auVar22._12_4_;
  auVar32 = vfmsub213ps_fma(auVar32,auVar55,auVar27);
  auVar22 = vfnmadd213ps_fma(auVar22,auVar14,auVar27);
  auVar61._0_4_ = auVar32._0_4_ + auVar22._0_4_;
  auVar61._4_4_ = auVar32._4_4_ + auVar22._4_4_;
  auVar61._8_4_ = auVar32._8_4_ + auVar22._8_4_;
  auVar61._12_4_ = auVar32._12_4_ + auVar22._12_4_;
  fVar57 = auVar55._0_4_;
  fVar42 = (s->super_Tuple3<pbrt::Point3,_float>).z - (pRef->super_Tuple3<pbrt::Point3,_float>).z;
  auVar22 = ZEXT416((uint)(fVar57 * auVar50._0_4_));
  auVar32 = vfmsub213ss_fma(auVar14,auVar36,auVar22);
  auVar22 = vfnmadd231ss_fma(auVar22,auVar55,auVar50);
  fVar51 = auVar32._0_4_ + auVar22._0_4_;
  fVar56 = (s->super_Tuple3<pbrt::Point3,_float>).y - (pRef->super_Tuple3<pbrt::Point3,_float>).y;
  fVar54 = (s->super_Tuple3<pbrt::Point3,_float>).x - (pRef->super_Tuple3<pbrt::Point3,_float>).x;
  auVar32 = vfmadd231ss_fma(ZEXT416((uint)(fVar58 * fVar56)),ZEXT416((uint)fVar54),auVar50);
  auVar50 = vfmadd231ss_fma(ZEXT416((uint)(fVar57 * fVar56)),ZEXT416((uint)fVar54),auVar36);
  auVar33 = vfmadd231ss_fma(auVar32,ZEXT416((uint)fVar42),auVar33);
  auVar32 = vmovshdup_avx(auVar61);
  auVar50 = vfmadd231ss_fma(auVar50,ZEXT416((uint)fVar42),auVar35);
  auVar32 = vfmadd231ss_fma(ZEXT416((uint)(fVar56 * auVar32._0_4_)),auVar61,ZEXT416((uint)fVar54));
  auVar32 = vfmadd231ss_fma(auVar32,ZEXT416((uint)fVar51),ZEXT416((uint)fVar42));
  fVar42 = auVar32._0_4_;
  auVar35._0_8_ = auVar32._0_8_ ^ 0x8000000080000000;
  auVar35._8_4_ = auVar32._8_4_ ^ 0x80000000;
  auVar35._12_4_ = auVar32._12_4_ ^ 0x80000000;
  if (-fVar42 < fVar42) {
    uVar20 = CONCAT44(auVar61._4_4_,auVar61._0_4_);
    auVar61._0_8_ = uVar20 ^ 0x8000000080000000;
    auVar61._8_4_ = -auVar61._8_4_;
    auVar61._12_4_ = -auVar61._12_4_;
  }
  auVar23 = vaddss_avx512f(auVar34,auVar50);
  fVar63 = auVar33._0_4_;
  fVar56 = fVar63 + auVar31._0_4_;
  auVar22 = vmulss_avx512f(auVar33,auVar23);
  auVar31 = vfmsub213ss_fma(auVar33,auVar50,auVar22);
  auVar34 = vfnmadd213ss_fma(auVar23,auVar33,auVar22);
  auVar22 = vfmsub231ss_avx512f(auVar22,auVar23,ZEXT416((uint)fVar56));
  auVar32 = vminss_avx(auVar35,auVar32);
  fVar62 = auVar32._0_4_;
  fVar40 = fVar63 * fVar62;
  fVar54 = auVar34._0_4_ + auVar31._0_4_;
  fVar60 = auVar34._0_4_ + auVar22._0_4_;
  auVar31 = vfmsub213ss_fma(auVar32,auVar33,ZEXT416((uint)fVar40));
  auVar18 = vfnmadd213ss_fma(auVar33,auVar32,ZEXT416((uint)fVar40));
  fVar39 = auVar31._0_4_ + auVar18._0_4_;
  fVar64 = auVar50._0_4_;
  fVar53 = fVar64 * fVar62;
  auVar31 = vfmsub213ss_fma(auVar23,auVar32,ZEXT416((uint)fVar53));
  auVar19 = vfnmadd213ss_fma(auVar32,auVar50,ZEXT416((uint)fVar53));
  auVar22 = vfmsub231ss_fma(ZEXT416((uint)fVar53),auVar32,auVar50);
  fVar53 = auVar31._0_4_ + auVar19._0_4_;
  auVar31 = vfmadd231ss_fma(ZEXT416((uint)(fVar53 * fVar53)),ZEXT416((uint)fVar39),
                            ZEXT416((uint)fVar39));
  auVar31 = vfmadd231ss_fma(auVar31,ZEXT416((uint)fVar54),ZEXT416((uint)fVar54));
  auVar31 = vsqrtss_avx(auVar31,auVar31);
  auVar24 = vdivss_avx512f(ZEXT416((uint)fVar39),auVar31);
  auVar25 = vdivss_avx512f(ZEXT416((uint)fVar53),auVar31);
  auVar26 = vdivss_avx512f(ZEXT416((uint)fVar54),auVar31);
  auVar27 = vmulss_avx512f(auVar23,auVar32);
  fVar54 = fVar56 * fVar62;
  auVar49 = ZEXT416((uint)fVar56);
  auVar31 = vfmsub213ss_fma(auVar23,auVar32,auVar27);
  auVar28 = vfnmadd213ss_avx512f(auVar32,auVar23,auVar27);
  auVar34 = vfmsub213ss_fma(auVar32,auVar33,ZEXT416((uint)fVar54));
  auVar30 = vfnmadd213ss_fma(auVar49,auVar32,ZEXT416((uint)fVar54));
  auVar27 = vfmsub231ss_fma(auVar27,auVar32,auVar50);
  auVar29 = vfmsub231ss_fma(ZEXT416((uint)fVar54),auVar49,auVar32);
  fVar54 = auVar31._0_4_ + auVar28._0_4_;
  fVar39 = auVar34._0_4_ + auVar30._0_4_;
  fVar53 = auVar27._0_4_ + auVar28._0_4_;
  fVar52 = auVar29._0_4_ + auVar30._0_4_;
  fVar65 = auVar26._0_4_;
  fVar66 = auVar25._0_4_;
  fVar67 = auVar24._0_4_;
  auVar31 = vfmadd231ss_fma(ZEXT416((uint)(fVar54 * fVar54)),ZEXT416((uint)fVar39),
                            ZEXT416((uint)fVar39));
  auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar53 * fVar53)),ZEXT416((uint)fVar52),
                            ZEXT416((uint)fVar52));
  auVar31 = vfmadd231ss_fma(auVar31,ZEXT416((uint)fVar60),ZEXT416((uint)fVar60));
  auVar31 = vsqrtss_avx(auVar31,auVar31);
  auVar29 = vdivss_avx512f(ZEXT416((uint)fVar54),auVar31);
  fVar60 = fVar60 / auVar31._0_4_;
  auVar28 = ZEXT416((uint)fVar60);
  fVar54 = fVar64 * fVar56;
  auVar30 = vdivss_avx512f(ZEXT416((uint)fVar39),auVar31);
  auVar31 = vfmsub213ss_avx512f(auVar49,auVar23,ZEXT416((uint)fVar54));
  auVar27 = vfnmadd213ss_fma(auVar50,auVar49,ZEXT416((uint)fVar54));
  auVar33 = vfmsub231ss_fma(ZEXT416((uint)fVar54),auVar50,auVar33);
  fVar54 = auVar27._0_4_ + auVar31._0_4_;
  auVar31 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar54),ZEXT416((uint)fVar54));
  fVar68 = auVar29._0_4_;
  fVar69 = auVar30._0_4_;
  auVar31 = vsqrtss_avx(auVar31,auVar31);
  auVar32 = vfmsub231ss_fma(ZEXT416((uint)fVar40),auVar49,auVar32);
  fVar39 = auVar32._0_4_ + auVar18._0_4_;
  fVar40 = auVar22._0_4_ + auVar19._0_4_;
  fVar41 = auVar27._0_4_ + auVar33._0_4_;
  auVar32 = vfmadd231ss_fma(ZEXT416((uint)(fVar40 * fVar40)),ZEXT416((uint)fVar39),
                            ZEXT416((uint)fVar39));
  auVar32 = vfmadd231ss_fma(auVar32,ZEXT416((uint)fVar41),ZEXT416((uint)fVar41));
  fVar59 = auVar31._0_4_;
  fVar52 = fVar52 / fVar59;
  auVar32 = vsqrtss_avx(auVar32,auVar32);
  fVar53 = fVar53 / fVar59;
  fVar38 = auVar32._0_4_;
  auVar32 = vmulss_avx512f(auVar29,auVar25);
  auVar32 = vfnmsub231ss_avx512f(auVar32,auVar24,auVar30);
  fVar54 = fVar54 / fVar59;
  auVar31 = ZEXT416((uint)fVar54);
  auVar32 = vfnmadd231ss_avx512f(auVar32,auVar26,auVar28);
  if (0.0 <= auVar32._0_4_) {
    auVar32 = vaddss_avx512f(auVar29,auVar25);
    auVar33 = vaddss_avx512f(auVar30,auVar24);
    auVar34 = vaddss_avx512f(auVar28,auVar26);
    auVar32 = vfmadd231ss_fma(ZEXT416((uint)(auVar32._0_4_ * auVar32._0_4_)),auVar33,auVar33);
    auVar32 = vfmadd231ss_fma(auVar32,auVar34,auVar34);
    auVar32 = vsqrtss_avx(auVar32,auVar32);
    auVar33 = ZEXT416((uint)(auVar32._0_4_ * 0.5));
    auVar32 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar33);
    uVar15 = vcmpss_avx512f(auVar33,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar16 = (bool)((byte)uVar15 & 1);
    local_120 = asinf((float)((uint)bVar16 * -0x40800000 + (uint)!bVar16 * auVar32._0_4_));
    local_120 = local_120 + local_120;
  }
  else {
    auVar32 = vsubss_avx512f(auVar29,auVar25);
    auVar33 = vsubss_avx512f(auVar30,auVar24);
    auVar34 = vsubss_avx512f(auVar28,auVar26);
    auVar32 = vfmadd231ss_fma(ZEXT416((uint)(auVar32._0_4_ * auVar32._0_4_)),auVar33,auVar33);
    auVar32 = vfmadd231ss_fma(auVar32,auVar34,auVar34);
    auVar32 = vsqrtss_avx(auVar32,auVar32);
    auVar33 = ZEXT416((uint)(auVar32._0_4_ * 0.5));
    auVar32 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar33);
    uVar15 = vcmpss_avx512f(auVar33,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar16 = (bool)((byte)uVar15 & 1);
    auVar43._0_4_ = asinf((float)((uint)bVar16 * -0x40800000 + (uint)!bVar16 * auVar32._0_4_));
    auVar43._4_60_ = extraout_var;
    auVar32 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar43._0_16_,ZEXT416(0x40490fdb));
    local_120 = auVar32._0_4_;
  }
  fVar39 = fVar39 / fVar38;
  auVar32 = vfnmsub231ss_fma(ZEXT416((uint)(fVar53 * fVar68)),ZEXT416((uint)fVar69),
                             ZEXT416((uint)fVar52));
  auVar32 = vfnmadd231ss_fma(auVar32,ZEXT416((uint)fVar60),auVar31);
  fVar40 = fVar40 / fVar38;
  fVar41 = fVar41 / fVar38;
  if (0.0 <= auVar32._0_4_) {
    auVar32 = vfmadd231ss_fma(ZEXT416((uint)((fVar53 + fVar68) * (fVar53 + fVar68))),
                              ZEXT416((uint)(fVar52 + fVar69)),ZEXT416((uint)(fVar52 + fVar69)));
    auVar32 = vfmadd231ss_fma(auVar32,ZEXT416((uint)(fVar54 + fVar60)),
                              ZEXT416((uint)(fVar54 + fVar60)));
    auVar32 = vsqrtss_avx(auVar32,auVar32);
    auVar33 = ZEXT416((uint)(auVar32._0_4_ * 0.5));
    auVar32 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar33);
    uVar15 = vcmpss_avx512f(auVar33,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar16 = (bool)((byte)uVar15 & 1);
    local_130 = asinf((float)((uint)bVar16 * -0x40800000 + (uint)!bVar16 * auVar32._0_4_));
    local_130 = local_130 + local_130;
  }
  else {
    auVar32 = vfmadd231ss_fma(ZEXT416((uint)((fVar53 - fVar68) * (fVar53 - fVar68))),
                              ZEXT416((uint)(fVar52 - fVar69)),ZEXT416((uint)(fVar52 - fVar69)));
    auVar32 = vfmadd231ss_fma(auVar32,ZEXT416((uint)(fVar54 - fVar60)),
                              ZEXT416((uint)(fVar54 - fVar60)));
    auVar32 = vsqrtss_avx(auVar32,auVar32);
    auVar33 = ZEXT416((uint)(auVar32._0_4_ * 0.5));
    auVar32 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar33);
    uVar15 = vcmpss_avx512f(auVar33,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar16 = (bool)((byte)uVar15 & 1);
    auVar44._0_4_ = asinf((float)((uint)bVar16 * -0x40800000 + (uint)!bVar16 * auVar32._0_4_));
    auVar44._4_60_ = extraout_var_00;
    auVar32 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar44._0_16_,ZEXT416(0x40490fdb));
    local_130 = auVar32._0_4_;
  }
  auVar32 = vfnmsub231ss_fma(ZEXT416((uint)(fVar40 * fVar53)),ZEXT416((uint)fVar52),
                             ZEXT416((uint)fVar39));
  auVar32 = vfnmadd231ss_fma(auVar32,auVar31,ZEXT416((uint)fVar41));
  if (0.0 <= auVar32._0_4_) {
    auVar32 = vfmadd231ss_fma(ZEXT416((uint)((fVar40 + fVar53) * (fVar40 + fVar53))),
                              ZEXT416((uint)(fVar39 + fVar52)),ZEXT416((uint)(fVar39 + fVar52)));
    auVar32 = vfmadd231ss_fma(auVar32,ZEXT416((uint)(fVar41 + fVar54)),
                              ZEXT416((uint)(fVar41 + fVar54)));
    auVar32 = vsqrtss_avx(auVar32,auVar32);
    auVar33 = ZEXT416((uint)(auVar32._0_4_ * 0.5));
    auVar32 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar33);
    uVar15 = vcmpss_avx512f(auVar33,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar16 = (bool)((byte)uVar15 & 1);
    local_138 = asinf((float)((uint)bVar16 * -0x40800000 + (uint)!bVar16 * auVar32._0_4_));
    local_138 = local_138 + local_138;
  }
  else {
    auVar32 = vfmadd231ss_fma(ZEXT416((uint)((fVar40 - fVar53) * (fVar40 - fVar53))),
                              ZEXT416((uint)(fVar39 - fVar52)),ZEXT416((uint)(fVar39 - fVar52)));
    auVar32 = vfmadd231ss_fma(auVar32,ZEXT416((uint)(fVar41 - fVar54)),
                              ZEXT416((uint)(fVar41 - fVar54)));
    auVar32 = vsqrtss_avx(auVar32,auVar32);
    auVar33 = ZEXT416((uint)(auVar32._0_4_ * 0.5));
    auVar32 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar33);
    uVar15 = vcmpss_avx512f(auVar33,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar16 = (bool)((byte)uVar15 & 1);
    auVar45._0_4_ = asinf((float)((uint)bVar16 * -0x40800000 + (uint)!bVar16 * auVar32._0_4_));
    auVar45._4_60_ = extraout_var_01;
    auVar32 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar45._0_16_,ZEXT416(0x40490fdb));
    local_138 = auVar32._0_4_;
  }
  auVar32 = vfnmsub231ss_fma(ZEXT416((uint)(fVar66 * fVar40)),ZEXT416((uint)fVar39),
                             ZEXT416((uint)fVar67));
  auVar32 = vfnmadd231ss_fma(auVar32,ZEXT416((uint)fVar41),ZEXT416((uint)fVar65));
  if (0.0 <= auVar32._0_4_) {
    auVar32 = vfmadd231ss_fma(ZEXT416((uint)((fVar66 + fVar40) * (fVar66 + fVar40))),
                              ZEXT416((uint)(fVar67 + fVar39)),ZEXT416((uint)(fVar67 + fVar39)));
    auVar32 = vfmadd231ss_fma(auVar32,ZEXT416((uint)(fVar65 + fVar41)),
                              ZEXT416((uint)(fVar65 + fVar41)));
    auVar32 = vsqrtss_avx(auVar32,auVar32);
    auVar33 = ZEXT416((uint)(auVar32._0_4_ * 0.5));
    auVar32 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar33);
    uVar15 = vcmpss_avx512f(auVar33,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar16 = (bool)((byte)uVar15 & 1);
    local_134 = asinf((float)((uint)bVar16 * -0x40800000 + (uint)!bVar16 * auVar32._0_4_));
    local_134 = local_134 + local_134;
  }
  else {
    auVar32 = vfmadd231ss_fma(ZEXT416((uint)((fVar66 - fVar40) * (fVar66 - fVar40))),
                              ZEXT416((uint)(fVar67 - fVar39)),ZEXT416((uint)(fVar67 - fVar39)));
    auVar32 = vfmadd231ss_fma(auVar32,ZEXT416((uint)(fVar65 - fVar41)),
                              ZEXT416((uint)(fVar65 - fVar41)));
    auVar32 = vsqrtss_avx(auVar32,auVar32);
    auVar33 = ZEXT416((uint)(auVar32._0_4_ * 0.5));
    auVar32 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar33);
    uVar15 = vcmpss_avx512f(auVar33,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar16 = (bool)((byte)uVar15 & 1);
    auVar46._0_4_ = asinf((float)((uint)bVar16 * -0x40800000 + (uint)!bVar16 * auVar32._0_4_));
    auVar46._4_60_ = extraout_var_02;
    auVar32 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar46._0_16_,ZEXT416(0x40490fdb));
    local_134 = auVar32._0_4_;
  }
  if (SampleSphericalRectangle(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point2<float>const&,float*)
      ::reg == '\0') {
    iVar21 = __cxa_guard_acquire(&SampleSphericalRectangle(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point2<float>const&,float*)
                                  ::reg);
    if (iVar21 != 0) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)
                 &SampleSphericalRectangle(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point2<float>const&,float*)
                  ::reg,SampleSphericalRectangle(pbrt::Point3<float>const&,pbrt::
                        Point3<float>const&,pbrt::Vector3<float>const&,pbrt::
                        Vector3<float>const&,pbrt::Point2<float>const&,float*)::$_0::__invoke(pbrt::
                        StatsAccumulator__,(PixelAccumFunc)0x0);
      __cxa_guard_release(&SampleSphericalRectangle(pbrt::Point3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Point2<float>const&,float*)
                           ::reg);
    }
  }
  *(long *)(in_FS_OFFSET + -0x448) = *(long *)(in_FS_OFFSET + -0x448) + 1;
  dVar13 = (double)local_120 + (double)local_130 + (double)local_138 + (double)local_134 +
           -6.2831854820251465;
  auVar33._0_4_ = (float)dVar13;
  auVar33._4_4_ = (int)((ulong)dVar13 >> 0x20);
  auVar33._8_8_ = 0;
  if (auVar33._0_4_ <= 0.0) {
    *(long *)(in_FS_OFFSET + -0x450) = *(long *)(in_FS_OFFSET + -0x450) + 1;
    if (pdf != (Float *)0x0) {
      *pdf = 0.0;
    }
    fVar54 = (u->super_Tuple2<pbrt::Point2,_float>).x;
    fVar51 = (u->super_Tuple2<pbrt::Point2,_float>).y;
    fVar42 = fVar54 * (ex->super_Tuple3<pbrt::Vector3,_float>).x;
  }
  else {
    if (pdf != (Float *)0x0) {
      auVar34._0_4_ = 1.0 / auVar33._0_4_;
      auVar34._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar32 = vmaxss_avx(auVar34,ZEXT816(0) << 0x40);
      *pdf = auVar32._0_4_;
    }
    fVar54 = (u->super_Tuple2<pbrt::Point2,_float>).x;
    if (0.001 <= auVar33._0_4_) {
      uVar15 = vcmpss_avx512f(auVar35,ZEXT416((uint)fVar42),1);
      bVar16 = (bool)((byte)uVar15 & 1);
      auVar22._8_4_ = 0x80000000;
      auVar22._0_8_ = 0x8000000080000000;
      auVar22._12_4_ = 0x80000000;
      auVar35 = vxorps_avx512vl(ZEXT416((uint)fVar51),auVar22);
      auVar32 = vfmsub213ss_fma(auVar33,ZEXT416((uint)fVar54),ZEXT416((uint)local_138));
      auVar29._8_4_ = 0x80000000;
      auVar29._0_8_ = 0x8000000080000000;
      auVar29._12_4_ = 0x80000000;
      auVar31 = vxorps_avx512vl(auVar31,auVar29);
      local_134 = auVar32._0_4_ - local_134;
      auVar47._0_4_ = cosf(local_134);
      auVar47._4_60_ = extraout_var_03;
      local_118 = auVar31._0_4_;
      auVar31 = vfmadd213ss_fma(auVar47._0_16_,ZEXT416((uint)fVar65),ZEXT416(local_118));
      fVar42 = sinf(local_134);
      auVar32 = vinsertps_avx(ZEXT416((uint)fVar56),ZEXT416((uint)fVar63),0x10);
      auVar24._0_4_ = auVar31._0_4_ / fVar42;
      auVar24._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar31 = ZEXT416((uint)(fVar65 * fVar65 + auVar24._0_4_ * auVar24._0_4_));
      auVar31 = vsqrtss_avx(auVar31,auVar31);
      auVar18._8_4_ = 0x7fffffff;
      auVar18._0_8_ = 0x7fffffff7fffffff;
      auVar18._12_4_ = 0x7fffffff;
      auVar33 = vpternlogd_avx512vl(ZEXT416((uint)(1.0 / auVar31._0_4_)),auVar24,auVar18,0xe4);
      auVar31 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar33);
      uVar15 = vcmpss_avx512f(auVar33,SUB6416(ZEXT464(0xbf7fffff),0),1);
      bVar17 = (bool)((byte)uVar15 & 1);
      auVar30._4_12_ = auVar31._4_12_;
      auVar30._0_4_ = (float)((uint)bVar17 * -0x40800001 + (uint)!bVar17 * auVar31._0_4_);
      auVar19._8_4_ = 0x80000000;
      auVar19._0_8_ = 0x8000000080000000;
      auVar19._12_4_ = 0x80000000;
      auVar33 = vxorps_avx512vl(auVar30,auVar19);
      auVar25._0_12_ = ZEXT812(0);
      auVar25._12_4_ = 0;
      auVar31 = vmaxss_avx(ZEXT416((uint)(1.0 - auVar30._0_4_ * auVar30._0_4_)),auVar25);
      auVar31 = vsqrtss_avx(auVar31,auVar31);
      auVar26._0_4_ = (fVar62 * auVar33._0_4_) / auVar31._0_4_;
      auVar26._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar31 = vminss_avx(ZEXT416(auVar23._0_4_),auVar26);
      uVar15 = vcmpss_avx512f(auVar26,auVar50,1);
      bVar17 = (bool)((byte)uVar15 & 1);
      fVar54 = (float)((uint)bVar17 * (int)fVar64 + (uint)!bVar17 * auVar31._0_4_);
      auVar31 = ZEXT416((uint)(fVar62 * fVar62 + fVar54 * fVar54));
      auVar31 = vsqrtss_avx(auVar31,auVar31);
      fVar60 = auVar31._0_4_;
      fVar42 = fVar60 * fVar60;
      auVar23._0_4_ = auVar32._0_4_ * auVar32._0_4_ + fVar42;
      auVar23._4_4_ = auVar32._4_4_ * auVar32._4_4_ + fVar42;
      auVar23._8_4_ = auVar32._8_4_ * auVar32._8_4_ + fVar42;
      auVar23._12_4_ = auVar32._12_4_ * auVar32._12_4_ + fVar42;
      auVar31 = vsqrtps_avx(auVar23);
      auVar32 = vdivps_avx(auVar32,auVar31);
      auVar31 = vhsubps_avx(auVar32,auVar32);
      auVar32 = vmovshdup_avx(auVar32);
      auVar32 = vfmadd132ss_fma(auVar31,auVar32,
                                ZEXT416((uint)(u->super_Tuple2<pbrt::Point2,_float>).y));
      fVar42 = auVar32._0_4_;
      if (fVar42 * fVar42 < 0.999999) {
        fVar56 = 1.0 - fVar42 * fVar42;
        if (fVar56 < 0.0) {
          fVar56 = sqrtf(fVar56);
        }
        else {
          auVar32 = vsqrtss_avx(ZEXT416((uint)fVar56),ZEXT416((uint)fVar56));
          fVar56 = auVar32._0_4_;
        }
        fVar56 = (fVar60 * fVar42) / fVar56;
      }
      auVar28._4_4_ = fVar54;
      auVar28._0_4_ = fVar54;
      auVar28._8_4_ = fVar54;
      auVar28._12_4_ = fVar54;
      auVar49._4_4_ = fVar56;
      auVar49._0_4_ = fVar56;
      auVar49._8_4_ = fVar56;
      auVar49._12_4_ = fVar56;
      auVar32 = vblendps_avx(auVar28,auVar49,2);
      local_68 = auVar36._0_4_;
      fStack_64 = auVar36._4_4_;
      fStack_60 = auVar36._8_4_;
      fStack_5c = auVar36._12_4_;
      auVar36._0_4_ = auVar32._0_4_ * local_68;
      auVar36._4_4_ = auVar32._4_4_ * fStack_64;
      auVar36._8_4_ = auVar32._8_4_ * fStack_60;
      auVar36._12_4_ = auVar32._12_4_ * fStack_5c;
      fStack_44 = auVar55._4_4_;
      fStack_40 = auVar55._8_4_;
      fStack_3c = auVar55._12_4_;
      auVar36 = vhaddps_avx(auVar36,auVar36);
      fVar42 = auVar61._0_4_ * fVar62 + auVar36._0_4_ + (pRef->super_Tuple3<pbrt::Point3,_float>).x;
      auVar36 = vpermi2ps_avx512vl(_DAT_004ffad0,auVar61,
                                   ZEXT416((uint)bVar16 * auVar35._0_4_ +
                                           (uint)!bVar16 * (int)fVar51));
      uVar6 = (pRef->super_Tuple3<pbrt::Point3,_float>).y;
      uVar12 = (pRef->super_Tuple3<pbrt::Point3,_float>).z;
      auVar48._0_4_ = (float)uVar6 + auVar36._0_4_ * fVar62 + fVar54 * fVar57 + fVar56 * fVar58;
      auVar48._4_4_ =
           (float)uVar12 + auVar36._4_4_ * fVar62 + fVar54 * fStack_44 + fVar56 * auVar14._4_4_;
      auVar48._8_4_ = auVar36._8_4_ * fVar62 + fVar54 * fStack_40 + fVar56 * auVar14._8_4_ + 0.0;
      auVar48._12_4_ = auVar36._12_4_ * fVar62 + fVar54 * fStack_3c + fVar56 * auVar14._12_4_ + 0.0;
      goto LAB_00321a55;
    }
    fVar42 = fVar54 * (ex->super_Tuple3<pbrt::Vector3,_float>).x;
    fVar51 = (u->super_Tuple2<pbrt::Point2,_float>).y;
  }
  fVar42 = fVar42 + (s->super_Tuple3<pbrt::Point3,_float>).x +
           fVar51 * (ey->super_Tuple3<pbrt::Vector3,_float>).x;
  uVar3 = (ex->super_Tuple3<pbrt::Vector3,_float>).y;
  uVar9 = (ex->super_Tuple3<pbrt::Vector3,_float>).z;
  uVar4 = (ey->super_Tuple3<pbrt::Vector3,_float>).y;
  uVar10 = (ey->super_Tuple3<pbrt::Vector3,_float>).z;
  uVar5 = (s->super_Tuple3<pbrt::Point3,_float>).y;
  uVar11 = (s->super_Tuple3<pbrt::Point3,_float>).z;
  auVar48._0_4_ = fVar54 * (float)uVar3 + (float)uVar5 + fVar51 * (float)uVar4;
  auVar48._4_4_ = fVar54 * (float)uVar9 + (float)uVar11 + fVar51 * (float)uVar10;
  auVar48._8_4_ = fVar54 * 0.0 + 0.0 + fVar51 * 0.0;
  auVar48._12_4_ = fVar54 * 0.0 + 0.0 + fVar51 * 0.0;
LAB_00321a55:
  auVar36 = vinsertps_avx(ZEXT416((uint)fVar42),auVar48,0x1c);
  auVar55 = vmovshdup_avx(auVar48);
  PVar70.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar36._0_8_;
  PVar70.super_Tuple3<pbrt::Point3,_float>.z = auVar55._0_4_;
  return (Point3f)PVar70.super_Tuple3<pbrt::Point3,_float>;
}

Assistant:

Point3f SampleSphericalRectangle(const Point3f &pRef, const Point3f &s,
                                 const Vector3f &ex, const Vector3f &ey, const Point2f &u,
                                 Float *pdf) {
    // Compute local reference frame and transform rectangle coordinates
    Float exl = Length(ex), eyl = Length(ey);
    Frame R = Frame::FromXY(ex / exl, ey / eyl);
    Vector3f dLocal = R.ToLocal(s - pRef);
    Float z0 = dLocal.z;

    // flip 'z' to make it point against 'Q'
    if (z0 > 0) {
        R.z = -R.z;
        z0 *= -1;
    }
    Float x0 = dLocal.x, y0 = dLocal.y;
    Float x1 = x0 + exl, y1 = y0 + eyl;

    // Find plane normals to rectangle edges and compute internal angles
    Vector3f v00(x0, y0, z0), v01(x0, y1, z0);
    Vector3f v10(x1, y0, z0), v11(x1, y1, z0);
    Vector3f n0 = Normalize(Cross(v00, v10)), n1 = Normalize(Cross(v10, v11));
    Vector3f n2 = Normalize(Cross(v11, v01)), n3 = Normalize(Cross(v01, v00));
    Float g0 = AngleBetween(-n0, n1), g1 = AngleBetween(-n1, n2);
    Float g2 = AngleBetween(-n2, n3), g3 = AngleBetween(-n3, n0);

    // Compute spherical rectangle solid angle and PDF
    Float solidAngle = double(g0) + double(g1) + double(g2) + double(g3) - 2. * Pi;
    CHECK_RARE(1e-5, solidAngle <= 0);
    if (solidAngle <= 0) {
        if (pdf != nullptr)
            *pdf = 0;
        return Point3f(s + u[0] * ex + u[1] * ey);
    }
    if (pdf != nullptr)
        *pdf = std::max<Float>(0, 1 / solidAngle);
    if (solidAngle < 1e-3)
        return Point3f(s + u[0] * ex + u[1] * ey);

    // Sample _cu_ for spherical rectangle sample
    Float b0 = n0.z, b1 = n2.z;
    // Float au = u[0] * solidAngle + k;   // original
    Float au = u[0] * solidAngle - g2 - g3;
    Float fu = (std::cos(au) * b0 - b1) / std::sin(au);
    Float cu = std::copysign(1 / std::sqrt(Sqr(fu) + Sqr(b0)), fu);
    cu = Clamp(cu, -OneMinusEpsilon, OneMinusEpsilon);  // avoid NaNs

    // Find _xu_ along $x$ edge for spherical rectangle sample
    Float xu = -(cu * z0) / SafeSqrt(1 - Sqr(cu));
    xu = Clamp(xu, x0, x1);

    // Find _xv_ along $y$ edge for spherical rectangle sample
    Float dd = std::sqrt(Sqr(xu) + Sqr(z0));
    Float h0 = y0 / std::sqrt(Sqr(dd) + Sqr(y0));
    Float h1 = y1 / std::sqrt(Sqr(dd) + Sqr(y1));
    Float hv = h0 + u[1] * (h1 - h0), hvsq = Sqr(hv);
    Float yv = (hvsq < 1 - 1e-6f) ? (hv * dd) / std::sqrt(1 - hvsq) : y1;

    // Return spherical triangle sample in original coordinate system
    return pRef + R.FromLocal(Vector3f(xu, yv, z0));
}